

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XercesXPath::XercesXPath
          (XercesXPath *this,XMLCh *xpathExpr,XMLStringPool *stringPool,
          XercesNamespaceResolver *scopeContext,uint emptyNamespaceId,bool isSelector,
          MemoryManager *manager)

{
  short *psVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t __n;
  CleanupType_conflict25 cleanup;
  JanitorMemFunCall<xercesc_4_0::XercesXPath> local_48;
  XMLCh *__dest;
  
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XercesXPath_0041bad0;
  this->fEmptyNamespaceId = emptyNamespaceId;
  this->fExpression = (XMLCh *)0x0;
  this->fLocationPaths = (RefVectorOf<xercesc_4_0::XercesLocationPath> *)0x0;
  this->fMemoryManager = manager;
  local_48.fToCall = (MFPT)cleanUp;
  local_48._16_8_ = 0;
  local_48.fObject = this;
  if (xpathExpr == (XMLCh *)0x0) {
    __dest = (XMLCh *)0x0;
  }
  else {
    __n = 0;
    do {
      psVar1 = (short *)((long)xpathExpr + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,__n);
    __dest = (XMLCh *)CONCAT44(extraout_var,iVar2);
    memcpy(__dest,xpathExpr,__n);
  }
  this->fExpression = __dest;
  parseExpression(this,stringPool,scopeContext);
  if (isSelector) {
    checkForSelectedAttributes(this);
  }
  local_48.fObject = (XercesXPath *)0x0;
  JanitorMemFunCall<xercesc_4_0::XercesXPath>::~JanitorMemFunCall(&local_48);
  return;
}

Assistant:

XercesXPath::XercesXPath(const XMLCh* const xpathExpr,
                         XMLStringPool* const stringPool,
                         XercesNamespaceResolver* const scopeContext,
                         const unsigned int emptyNamespaceId,
                         const bool isSelector,
                         MemoryManager* const manager)
    : fEmptyNamespaceId(emptyNamespaceId)
    , fExpression(0)
    , fLocationPaths(0)
    , fMemoryManager(manager)
{
    CleanupType cleanup(this, &XercesXPath::cleanUp);

    try
    {
        fExpression = XMLString::replicate(xpathExpr, fMemoryManager);
        parseExpression(stringPool, scopeContext);

        if (isSelector) {
            checkForSelectedAttributes();
        }
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}